

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void flush_output(iv_obj_t *codec_obj,vid_dec_ctx_t *ps_app_ctx,ivd_out_bufdesc_t *ps_out_buf,
                 UWORD8 *pu1_bs_buf,UWORD32 *pu4_op_frm_ts,FILE *ps_op_file,FILE *ps_op_chksum_file,
                 UWORD32 u4_ip_frm_ts,UWORD32 u4_bytes_remaining)

{
  ivd_video_decode_op_t s_video_decode_op;
  ivd_video_decode_ip_t s_video_decode_ip;
  ivd_ctl_flush_op_t s_ctl_op;
  ivd_ctl_flush_ip_t s_ctl_ip;
  WORD32 ret;
  FILE *ps_op_file_local;
  UWORD32 *pu4_op_frm_ts_local;
  UWORD8 *pu1_bs_buf_local;
  ivd_out_bufdesc_t *ps_out_buf_local;
  vid_dec_ctx_t *ps_app_ctx_local;
  iv_obj_t *codec_obj_local;
  
  do {
    if (ps_app_ctx->u4_max_frm_ts + ps_app_ctx->disp_delay <= *pu4_op_frm_ts) {
      return;
    }
    s_ctl_ip.e_cmd =
         ihevcd_cxa_api_function
                   ((iv_obj_t *)
                    CONCAT44(s_video_decode_op.u4_new_seq,s_video_decode_op.u4_frame_decoded_flag),
                    (void *)s_video_decode_op._16_8_,(void *)s_video_decode_op._8_8_);
    if (s_ctl_ip.e_cmd == IV_SUCCESS) {
      s_video_decode_op._132_4_ = 8;
      s_video_decode_op.u4_disp_buf_id = 800;
      s_ctl_ip.e_cmd =
           ihevcd_cxa_api_function
                     ((iv_obj_t *)
                      CONCAT44(s_video_decode_op.u4_new_seq,s_video_decode_op.u4_frame_decoded_flag)
                      ,(void *)s_video_decode_op._16_8_,(void *)s_video_decode_op._8_8_);
      if (s_video_decode_op.u4_frame_decoded_flag == 1) {
        dump_output(ps_app_ctx,(iv_yuv_buf_t *)&s_video_decode_op.u4_is_ref_flag,
                    s_video_decode_op.e4_fld_type,ps_op_file,ps_op_chksum_file,*pu4_op_frm_ts,
                    ps_app_ctx->u4_file_save_flag,ps_app_ctx->u4_chksum_save_flag);
        *pu4_op_frm_ts = *pu4_op_frm_ts + 1;
      }
    }
    else {
      printf("Error in Setting the decoder in flush mode\n");
    }
  } while (s_ctl_ip.e_cmd == 0);
  return;
}

Assistant:

void flush_output(iv_obj_t *codec_obj,
                  vid_dec_ctx_t *ps_app_ctx,
                  ivd_out_bufdesc_t *ps_out_buf,
                  UWORD8 *pu1_bs_buf,
                  UWORD32 *pu4_op_frm_ts,
                  FILE *ps_op_file,
                  FILE *ps_op_chksum_file,
                  UWORD32 u4_ip_frm_ts,
                  UWORD32 u4_bytes_remaining)
{
    WORD32 ret;

    do
    {

        ivd_ctl_flush_ip_t s_ctl_ip;
        ivd_ctl_flush_op_t s_ctl_op;

        if(*pu4_op_frm_ts >= (ps_app_ctx->u4_max_frm_ts + ps_app_ctx->disp_delay))
            break;

        s_ctl_ip.e_cmd = IVD_CMD_VIDEO_CTL;
        s_ctl_ip.e_sub_cmd = IVD_CMD_CTL_FLUSH;
        s_ctl_ip.u4_size = sizeof(ivd_ctl_flush_ip_t);
        s_ctl_op.u4_size = sizeof(ivd_ctl_flush_op_t);
        ret = ivd_cxa_api_function((iv_obj_t *)codec_obj, (void *)&s_ctl_ip,
                                   (void *)&s_ctl_op);

        if(ret != IV_SUCCESS)
        {
            printf("Error in Setting the decoder in flush mode\n");
        }

        if(IV_SUCCESS == ret)
        {
            ivd_video_decode_ip_t s_video_decode_ip;
            ivd_video_decode_op_t s_video_decode_op;

            s_video_decode_ip.e_cmd = IVD_CMD_VIDEO_DECODE;
            s_video_decode_ip.u4_ts = u4_ip_frm_ts;
            s_video_decode_ip.pv_stream_buffer = pu1_bs_buf;
            s_video_decode_ip.u4_num_Bytes = u4_bytes_remaining;
            s_video_decode_ip.u4_size = sizeof(ivd_video_decode_ip_t);
            s_video_decode_ip.s_out_buffer.u4_min_out_buf_size[0] =
                            ps_out_buf->u4_min_out_buf_size[0];
            s_video_decode_ip.s_out_buffer.u4_min_out_buf_size[1] =
                            ps_out_buf->u4_min_out_buf_size[1];
            s_video_decode_ip.s_out_buffer.u4_min_out_buf_size[2] =
                            ps_out_buf->u4_min_out_buf_size[2];

            s_video_decode_ip.s_out_buffer.pu1_bufs[0] =
                            ps_out_buf->pu1_bufs[0];
            s_video_decode_ip.s_out_buffer.pu1_bufs[1] =
                            ps_out_buf->pu1_bufs[1];
            s_video_decode_ip.s_out_buffer.pu1_bufs[2] =
                            ps_out_buf->pu1_bufs[2];
            s_video_decode_ip.s_out_buffer.u4_num_bufs =
                            ps_out_buf->u4_num_bufs;

            s_video_decode_op.u4_size = sizeof(ivd_video_decode_op_t);

            /*****************************************************************************/
            /*   API Call: Video Decode                                                  */
            /*****************************************************************************/
            ret = ivd_cxa_api_function((iv_obj_t *)codec_obj, (void *)&s_video_decode_ip,
                                       (void *)&s_video_decode_op);

            if(1 == s_video_decode_op.u4_output_present)
            {
                dump_output(ps_app_ctx, &(s_video_decode_op.s_disp_frm_buf),
                            s_video_decode_op.u4_disp_buf_id, ps_op_file,
                            ps_op_chksum_file,
                            *pu4_op_frm_ts, ps_app_ctx->u4_file_save_flag,
                            ps_app_ctx->u4_chksum_save_flag);

                (*pu4_op_frm_ts)++;
            }
        }
    }while(IV_SUCCESS == ret);

}